

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  JSAMPROW pJVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long local_58;
  long local_50;
  
  iVar5 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  uVar9 = (uint)*(byte *)((long)&cinfo->downsample[6].start_pass + (long)compptr->component_index);
  bVar1 = *(byte *)((long)&cinfo->downsample[6].downsample + (long)compptr->component_index + 2);
  uVar4 = (ulong)bVar1;
  iVar10 = cinfo->max_v_samp_factor;
  if (0 < (long)iVar10) {
    uVar2 = cinfo->image_width;
    if (0 < (int)(iVar5 * uVar9 - uVar2)) {
      lVar11 = 0;
      do {
        memset(input_data[lVar11] + uVar2,(uint)input_data[lVar11][(ulong)uVar2 - 1],
               (ulong)(iVar5 * uVar9 + ~uVar2) + 1);
        lVar11 = lVar11 + 1;
      } while (iVar10 != lVar11);
    }
  }
  if (0 < cinfo->max_v_samp_factor) {
    uVar2 = bVar1 * uVar9;
    local_50 = 0;
    local_58 = 0;
    do {
      if (iVar5 != 0) {
        pJVar7 = output_data[local_50];
        uVar8 = 0;
        iVar10 = 0;
        do {
          if (uVar4 == 0) {
            lVar11 = 0;
          }
          else {
            uVar3 = 0;
            lVar11 = 0;
            do {
              if (uVar9 != 0) {
                lVar6 = 0;
                do {
                  lVar11 = lVar11 + (ulong)input_data[local_58 + uVar3][lVar6 + uVar8];
                  lVar6 = lVar6 + 1;
                } while (uVar9 != (uint)lVar6);
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 != uVar4);
          }
          *pJVar7 = (JSAMPLE)((long)(lVar11 + (ulong)(uVar2 >> 1)) / (long)(ulong)uVar2);
          pJVar7 = pJVar7 + 1;
          iVar10 = iVar10 + 1;
          uVar8 = (ulong)((int)uVar8 + uVar9);
        } while (iVar10 != iVar5);
      }
      local_58 = local_58 + uVar4;
      local_50 = local_50 + 1;
    } while (local_58 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;	/* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  JSAMPROW inptr, outptr;
  INT32 outvalue;

  h_expand = downsample->h_expand[compptr->component_index];
  v_expand = downsample->v_expand[compptr->component_index];
  numpix = h_expand * v_expand;
  numpix2 = numpix/2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * h_expand);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
	 outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
	inptr = input_data[inrow+v] + outcol_h;
	for (h = 0; h < h_expand; h++) {
	  outvalue += (INT32) GETJSAMPLE(*inptr++);
	}
      }
      *outptr++ = (JSAMPLE) ((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
    outrow++;
  }
}